

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O1

void __thiscall cppassert::internal::StackTraceImpl::collect(StackTraceImpl *this)

{
  char *pcVar1;
  int iVar2;
  char **ppcVar3;
  ulong uVar4;
  CppDemangler demangler;
  BackTraceSymbol local_58;
  CppDemangler local_40;
  
  if (this->symbols_ != (char **)0x0) {
    free(this->symbols_);
  }
  local_40.funcNameSize_ = 0x100;
  local_40.funcName_ = (char *)0x0;
  local_40.funcName_ = (char *)malloc(0x100);
  iVar2 = backtrace(this->backtrace_,0x100);
  this->backtraceSize_ = (long)iVar2;
  ppcVar3 = (char **)backtrace_symbols(this->backtrace_,iVar2);
  this->symbols_ = ppcVar3;
  if (2 < this->backtraceSize_) {
    ppcVar3 = &this->demangledSymbols_[2].allocated_;
    uVar4 = 2;
    do {
      if (this->symbols_ == (char **)0x0) {
        if (*ppcVar3 != (char *)0x0) {
          free(*ppcVar3);
          *ppcVar3 = (char *)0x0;
        }
        *ppcVar3 = (char *)0x0;
        ((BackTraceSymbol *)(ppcVar3 + -1))->symbol_ = "<unkown>";
      }
      else {
        BackTraceSymbol::createFromBacktraceStr(&local_58,this->symbols_[uVar4],&local_40);
        if (*ppcVar3 != (char *)0x0) {
          free(*ppcVar3);
          *ppcVar3 = (char *)0x0;
        }
        *ppcVar3 = local_58.allocated_;
        ((BackTraceSymbol *)(ppcVar3 + -1))->symbol_ = local_58.symbol_;
        local_58.symbol_ = (char *)0x0;
        local_58.allocated_ = (char *)0x0;
      }
      pcVar1 = ((BackTraceSymbol *)(ppcVar3 + -1))->symbol_;
      ppcVar3[-0x205] = (char *)this->backtrace_[uVar4];
      ppcVar3[-0x204] = pcVar1;
      uVar4 = uVar4 + 1;
      ppcVar3 = ppcVar3 + 2;
    } while (uVar4 < this->backtraceSize_);
  }
  if (local_40.funcName_ != (char *)0x0) {
    free(local_40.funcName_);
  }
  return;
}

Assistant:

void collect()
    {
        freeSymbols();
        CppDemangler demangler;
        backtraceSize_ = ::backtrace(backtrace_, BufferSize);
        symbols_ = ::backtrace_symbols(backtrace_, backtraceSize_);

        for(std::size_t i=cFramesToSkip; i<backtraceSize_; ++i)
        {
            if(symbols_)
            {
                demangledSymbols_[i]
                    = BackTraceSymbol::createFromBacktraceStr(symbols_[i]
                                                            , &demangler);
            }
            else
            {
                demangledSymbols_[i] = BackTraceSymbol();
            }

            frames_[i-cFramesToSkip] = StackTrace::StackFrame(backtrace_[i]
                                            , demangledSymbols_[i].symbol());
        }
    }